

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O2

QByteArray *
QSslCertificatePrivate::subjectInfoToString(QByteArray *__return_storage_ptr__,SubjectInfo info)

{
  char *str;
  size_t sStack_10;
  
  switch(info) {
  case Organization:
    str = "O";
    break;
  case CommonName:
    str = "CN";
    goto LAB_001bfb01;
  case LocalityName:
    str = "L";
    break;
  case OrganizationalUnitName:
    str = "OU";
    goto LAB_001bfb01;
  case CountryName:
    str = "C";
    break;
  case StateOrProvinceName:
    str = "ST";
LAB_001bfb01:
    sStack_10 = 2;
    goto LAB_001bfb19;
  case DistinguishedNameQualifier:
    str = "dnQualifier";
    sStack_10 = 0xb;
    goto LAB_001bfb19;
  case SerialNumber:
    str = "serialNumber";
    goto LAB_001bfb17;
  case EmailAddress:
    str = "emailAddress";
LAB_001bfb17:
    sStack_10 = 0xc;
    goto LAB_001bfb19;
  default:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
  sStack_10 = 1;
LAB_001bfb19:
  Qt::Literals::StringLiterals::operator____ba(__return_storage_ptr__,str,sStack_10);
  return __return_storage_ptr__;
}

Assistant:

QByteArray QSslCertificatePrivate::subjectInfoToString(QSslCertificate::SubjectInfo info)
{
    switch (info) {
    case QSslCertificate::Organization: return "O"_ba;
    case QSslCertificate::CommonName: return "CN"_ba;
    case QSslCertificate::LocalityName: return"L"_ba;
    case QSslCertificate::OrganizationalUnitName: return "OU"_ba;
    case QSslCertificate::CountryName: return "C"_ba;
    case QSslCertificate::StateOrProvinceName: return "ST"_ba;
    case QSslCertificate::DistinguishedNameQualifier: return "dnQualifier"_ba;
    case QSslCertificate::SerialNumber: return "serialNumber"_ba;
    case QSslCertificate::EmailAddress: return "emailAddress"_ba;
    }
    return QByteArray();
}